

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_new(lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                       uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  ushort uVar1;
  lysc_node *plVar2;
  ly_ht *ht;
  ly_ctx *ctx;
  ly_ctx *plVar3;
  lys_module *plVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  uint uVar8;
  lys_module *plVar9;
  lyd_node *plVar10;
  undefined8 unaff_R13;
  ulong uVar11;
  lysc_node *plVar12;
  bool bVar13;
  lysc_node *local_58;
  uint32_t local_4c;
  lys_module *local_48;
  lyd_node *node;
  uint local_34;
  
  if ((first == (lyd_node **)0x0) || (sparent == (lysc_node *)0x0 && mod == (lys_module *)0x0)) {
    __assert_fail("first && (sparent || mod)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x3af,
                  "LY_ERR lyd_validate_new(struct lyd_node **, const struct lysc_node *, const struct lys_module *, const struct lysc_ext_instance *, uint32_t, uint32_t, struct ly_ht *, struct lyd_node **)"
                 );
  }
  LVar6 = lyd_validate_choice_r(first,sparent,mod,ext,val_opts,int_opts,getnext_ht,diff);
  if (LVar6 == LY_EVALID) {
    if ((val_opts & 4) != 0) {
      uVar11 = 0;
      goto LAB_001a93ed;
    }
    LVar6 = LY_EVALID;
  }
  else if (LVar6 == LY_SUCCESS) {
    uVar11 = CONCAT71((int7)((ulong)unaff_R13 >> 8),(val_opts & 4) == 0);
LAB_001a93ed:
    node = *first;
    local_48 = (lys_module *)0x0;
    do {
      while( true ) {
        if (node == (lyd_node *)0x0) {
          return LVar6;
        }
        if (node->schema == (lysc_node *)0x0) {
          return LVar6;
        }
        if ((mod != (lys_module *)0x0) && (plVar9 = lyd_owner_module(node), plVar9 != mod)) {
          return LVar6;
        }
        uVar8 = node->flags;
        if ((uVar8 & 5) != 0) break;
        node = node->next;
      }
      local_34 = (uint)uVar11;
      plVar9 = (lys_module *)node->schema;
      uVar1 = *(ushort *)&plVar9->ctx;
      local_4c = val_opts;
      plVar4 = local_48;
      if (uVar1 == 1) {
        bVar13 = (bool)(*(byte *)((long)&plVar9->ctx + 2) >> 7);
LAB_001a948a:
        if ((plVar9 != local_48 && bVar13 == false) && ((uVar8 & 4) != 0)) {
          if (uVar1 != 8) {
            if ((uVar1 & 5) == 0) {
              __assert_fail("schema->nodetype & (LYS_LEAF | LYS_CONTAINER)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                            ,800,
                            "ly_bool lyd_validate_autodel_cont_leaf_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                           );
            }
            lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_58);
LAB_001a9502:
            if ((local_58 != (lysc_node *)0x0) && (local_58->module == plVar9)) {
              if ((*(uint32_t *)local_58->hash & 1) != 0) goto code_r0x001a951f;
              local_58 = (lysc_node *)0x0;
              local_48 = (lys_module *)0x0;
              lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_58);
              plVar12 = local_58;
              while ((local_58 = plVar12, local_58 != (lysc_node *)0x0 &&
                     (local_58->module == plVar9))) {
                plVar12 = local_58->next;
                if ((*(uint32_t *)local_58->hash & 1) != 0) {
                  lVar5 = lyd_validate_autodel_node_del
                                    (first,(lyd_node *)local_58,mod,0,&node,(ly_set *)0x0,
                                     (ly_set *)0x0,diff);
                  local_48 = (lys_module *)((ulong)local_48 & 0xff);
                  if (lVar5 != '\0') {
                    local_48 = (lys_module *)0x1;
                  }
                }
              }
              lVar5 = (ly_bool)local_48;
              goto LAB_001a98a0;
            }
            lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_58);
LAB_001a95bd:
            plVar4 = plVar9;
            if ((local_58 != (lysc_node *)0x0) && (local_58->module == plVar9)) {
              if ((*(uint *)local_58->hash & 5) != 1) goto code_r0x001a95d7;
              lVar5 = lyd_validate_autodel_node_del
                                (first,(lyd_node *)local_58,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,
                                 diff);
LAB_001a98a0:
              val_opts = local_4c;
              plVar4 = plVar9;
              local_48 = plVar9;
              if (lVar5 == '\0') goto LAB_001a95e6;
              goto LAB_001a96da;
            }
            goto LAB_001a95e6;
          }
LAB_001a94aa:
          lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_58);
LAB_001a94c0:
          plVar4 = plVar9;
          if ((local_58 != (lysc_node *)0x0) && (local_58->module == plVar9)) {
            if ((*(uint32_t *)local_58->hash & 1) != 0) goto code_r0x001a94d9;
            local_58 = (lysc_node *)0x0;
            lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_58);
            plVar12 = local_58;
            bVar13 = false;
            while ((local_58 = plVar12, local_58 != (lysc_node *)0x0 && (local_58->module == plVar9)
                   )) {
              plVar12 = local_58->next;
              if ((*(uint32_t *)local_58->hash & 1) != 0) {
                lVar5 = lyd_validate_autodel_node_del
                                  (first,(lyd_node *)local_58,mod,0,&node,(ly_set *)0x0,
                                   (ly_set *)0x0,diff);
                if (lVar5 != '\0') {
                  bVar13 = true;
                }
              }
            }
            val_opts = local_4c;
            local_48 = plVar9;
            if (!bVar13) goto LAB_001a95e6;
            goto LAB_001a96da;
          }
        }
      }
      else if (uVar1 == 8) {
        if (((plVar9->deviated_by != (lys_module **)0x0) && (plVar9 != local_48)) &&
           ((uVar8 & 4) != 0)) goto LAB_001a94aa;
      }
      else if (uVar1 == 4) {
        bVar13 = plVar9->deviated_by == (lys_module **)0x0;
        goto LAB_001a948a;
      }
LAB_001a95e6:
      local_48 = plVar4;
      plVar12 = (lysc_node *)node;
      uVar8 = node->flags;
      if ((uVar8 & 4) != 0) {
        plVar10 = *first;
        local_58 = (lysc_node *)node;
        plVar2 = node->schema;
        if (plVar2 == (lysc_node *)0x0) {
LAB_001a961e:
          if ((node->parent == (lyd_node_inner *)0x0) ||
             (ht = node->parent->children_ht, ht == (ly_ht *)0x0)) {
            for (; val_opts = local_4c, plVar10 != (lyd_node *)0x0; plVar10 = plVar10->next) {
              if ((lysc_node *)plVar10 != plVar12) {
                if ((((lyd_node *)plVar12)->schema->nodetype & 100) == 0) {
                  LVar7 = lyd_compare_single(plVar10,(lyd_node *)plVar12,0);
                  if (LVar7 == LY_SUCCESS) goto LAB_001a9720;
                }
                else if (plVar10->schema == ((lyd_node *)plVar12)->schema) goto LAB_001a9720;
              }
            }
          }
          else {
            LVar7 = lyht_find_next_with_collision_cb
                              (ht,&local_58,node->hash,lyd_val_dup_val_equal,(void **)0x0);
            plVar12 = local_58;
            val_opts = local_4c;
            if (LVar7 == LY_SUCCESS) {
LAB_001a9720:
              plVar3 = plVar12->module->ctx;
              ly_log_location((lysc_node *)0x0,(lyd_node *)plVar12,(char *)0x0,(ly_in *)0x0);
              val_opts = local_4c;
              ctx = ((lys_module *)local_58->module->name)->ctx;
              if (((local_4c & 8) == 0) || (((ulong)plVar3 & 0x18) == 0)) {
                ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Duplicate instance of \"%s\".");
                ly_log_location_revert(0,1,0,0);
                LVar6 = LY_EVALID;
                if ((char)local_34 != '\0') {
                  return LY_EVALID;
                }
              }
              else {
                ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Duplicate instance of \"%s\".");
                ly_log_location_revert(0,1,0,0);
              }
            }
          }
        }
        else {
          val_opts = local_4c;
          if (plVar2->nodetype == 8) {
            if ((plVar2->flags & 1) != 0) goto LAB_001a961e;
          }
          else if ((plVar2->nodetype != 0x10) || ((plVar2->flags & 0x200) == 0)) goto LAB_001a961e;
        }
        uVar8 = node->flags & 0xfffffffb;
        node->flags = uVar8;
      }
      if ((uVar8 & 1) != 0) {
        local_58 = (lysc_node *)0x0;
        plVar12 = node->schema;
        plVar2 = plVar12->parent;
        val_opts = local_4c;
        if ((plVar2 != (lysc_node *)0x0) && (plVar2->nodetype == 0x80)) {
          if (plVar2->parent->nodetype != 2) {
            __assert_fail("choic->nodetype == LYS_CHOICE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                          ,0x362,
                          "ly_bool lyd_validate_autodel_case_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                         );
          }
          if (plVar2->parent[1].parent != plVar2) {
            plVar10 = (lyd_node *)0x0;
            do {
              plVar10 = lys_getnext_data(plVar10,*first,&local_58,plVar12->parent,(lysc_module *)0x0
                                        );
              if (plVar10 == (lyd_node *)0x0) {
                lVar5 = lyd_validate_autodel_node_del
                                  (first,node,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,diff);
                val_opts = local_4c;
                if (lVar5 != '\0') goto LAB_001a96da;
                break;
              }
              val_opts = local_4c;
            } while ((plVar10->flags & 1) != 0);
          }
        }
      }
      node = node->next;
LAB_001a96da:
      uVar11 = (ulong)local_34;
    } while( true );
  }
  return LVar6;
code_r0x001a951f:
  local_58 = local_58->next;
  goto LAB_001a9502;
code_r0x001a95d7:
  local_58 = local_58->next;
  goto LAB_001a95bd;
code_r0x001a94d9:
  local_58 = local_58->next;
  goto LAB_001a94c0;
}

Assistant:

LY_ERR
lyd_validate_new(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *node;
    const struct lysc_node *last_dflt_schema = NULL;

    assert(first && (sparent || mod));

    /* validate choices */
    r = lyd_validate_choice_r(first, sparent, mod, ext, val_opts, int_opts, getnext_ht, diff);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

    node = *first;
    while (node) {
        if (!node->schema || (mod && (lyd_owner_module(node) != mod))) {
            /* opaque node or all top-level data from this module checked */
            break;
        }

        if (!(node->flags & (LYD_NEW | LYD_DEFAULT))) {
            /* check only new and default nodes */
            node = node->next;
            continue;
        }

        if (lyd_val_has_default(node->schema) && (node->schema != last_dflt_schema) && (node->flags & LYD_NEW)) {
            /* remove old default(s) of the new node if an explicit instance exists */
            last_dflt_schema = node->schema;
            if (node->schema->nodetype == LYS_LEAFLIST) {
                if (lyd_validate_autodel_leaflist_dflt(first, &node, mod, diff)) {
                    continue;
                }
            } else {
                if (lyd_validate_autodel_cont_leaf_dflt(first, &node, mod, diff)) {
                    continue;
                }
            }
        }

        if (node->flags & LYD_NEW) {
            /* then check new node instance duplicities */
            r = lyd_validate_duplicates(*first, node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* this node is valid */
            node->flags &= ~LYD_NEW;
        }

        if (node->flags & LYD_DEFAULT) {
            /* remove leftover default nodes from a no-longer existing case */
            if (lyd_validate_autodel_case_dflt(first, &node, mod, diff)) {
                continue;
            }
        }

        /* next iter */
        node = node->next;
    }

cleanup:
    return rc;
}